

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorStatus.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorStatus::Mode5InterrogatorStatus
          (Mode5InterrogatorStatus *this,KUINT8 IFFMission,Mode5MessageFormat MF,KBOOL OnOffStatus,
          KBOOL Damaged,KBOOL Malfunction)

{
  KBOOL Malfunction_local;
  KBOOL Damaged_local;
  KBOOL OnOffStatus_local;
  Mode5MessageFormat MF_local;
  KUINT8 IFFMission_local;
  Mode5InterrogatorStatus *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__Mode5InterrogatorStatus_0032f868;
  (this->m_StatusUnion).m_ui8Status = '\0';
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xf8 | IFFMission & 7;
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xf7 | ((byte)MF & 1) << 3
  ;
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xdf | OnOffStatus << 5;
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0xbf | Damaged << 6;
  (this->m_StatusUnion).m_ui8Status = (this->m_StatusUnion).m_ui8Status & 0x7f | Malfunction << 7;
  return;
}

Assistant:

Mode5InterrogatorStatus::Mode5InterrogatorStatus( KUINT8 IFFMission, KDIS::DATA_TYPE::ENUMS::Mode5MessageFormat MF, 
                                                  KBOOL OnOffStatus, KBOOL Damaged, KBOOL Malfunction )
{
	m_StatusUnion.m_ui8Status = 0; // Set all fields to 0
	m_StatusUnion.m_ui8IffMis = IFFMission;
	m_StatusUnion.m_ui8MsgFrmt = MF;
	m_StatusUnion.m_ui8OnOff = OnOffStatus;
	m_StatusUnion.m_ui8Dmg = Damaged;
	m_StatusUnion.m_ui8MalFnc = Malfunction;
}